

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.h
# Opt level: O0

void bandit::it(char *desc,voidfunc_t *func)

{
  listener *listener;
  contextstack_t *context_stack;
  assertion_adapter *assertion_adapter;
  run_policy *run_policy;
  function<void_()> local_38;
  voidfunc_t *local_18;
  voidfunc_t *func_local;
  char *desc_local;
  
  local_18 = func;
  func_local = (voidfunc_t *)desc;
  std::function<void_()>::function(&local_38,func);
  listener = detail::registered_listener((listener *)0x0);
  context_stack = detail::context_stack();
  assertion_adapter = detail::registered_adapter();
  run_policy = detail::registered_run_policy((run_policy *)0x0);
  it(desc,&local_38,listener,context_stack,assertion_adapter,run_policy);
  std::function<void_()>::~function(&local_38);
  return;
}

Assistant:

inline void it(const char* desc, detail::voidfunc_t func)
  {
    it(desc, func, detail::registered_listener(), detail::context_stack(), 
        detail::registered_adapter(), detail::registered_run_policy());
  }